

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O0

void generalMultTest1(int dim,int dl)

{
  pointer *ppdVar1;
  bool bVar2;
  Matrix *pMVar3;
  CSR *this;
  iterator iVar4;
  iterator iVar5;
  ostream *poVar6;
  CSC *pCVar7;
  reference pdVar8;
  double x_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<double,_std::allocator<double>_> *__range1_3;
  rep_conflict local_2c0;
  double durationSym4;
  rep_conflict local_2b0;
  rep_conflict local_2a8;
  Matrix *local_2a0;
  Matrix *result4;
  int local_28c;
  Matrix *pMStack_288;
  int i_3;
  Matrix *m2;
  double x_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  rep_conflict local_250;
  double durationSym3;
  rep_conflict local_240;
  rep_conflict local_238;
  Matrix *local_230;
  Matrix *result3;
  int local_21c;
  Matrix *pMStack_218;
  int i_2;
  Matrix *d2;
  diagonal *d1;
  double x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  rep_conflict local_1d8;
  double durationSym2;
  rep_conflict local_1c8;
  rep_conflict local_1c0;
  Matrix *local_1b8;
  Matrix *result2;
  int local_1a4;
  CSC *pCStack_1a0;
  int i_1;
  CSC *cc1;
  double dStack_190;
  int nnz;
  double x;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  rep_conflict local_160;
  double durationSym1;
  rep_conflict local_150;
  rep_conflict local_148;
  Matrix *local_140;
  Matrix *result1;
  int local_12c;
  duration<double,_std::ratio<1L,_1L>_> dStack_128;
  int i;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  string local_108;
  Matrix *local_e8;
  Matrix *v1;
  CSR *cr1;
  string local_d0;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8;
  Matrix *local_78;
  Matrix *dia1;
  vector<double,_std::allocator<double>_> tm4;
  vector<double,_std::allocator<double>_> tm3;
  vector<double,_std::allocator<double>_> tm2;
  vector<double,_std::allocator<double>_> tm1;
  int dl_local;
  int dim_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&dia1);
  pMVar3 = (Matrix *)operator_new(0x30);
  local_aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8," ",&local_a9);
  Matrix::Matrix(pMVar3,dim,dim,&local_a8);
  local_aa = 0;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  local_78 = pMVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"diagonal",(allocator *)((long)&cr1 + 7));
  Matrix::Random(pMVar3,dl,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cr1 + 7));
  Matrix::LowerTriangular(local_78);
  this = (CSR *)operator_new(0x30);
  CSR::CSR(this,local_78);
  v1 = (Matrix *)this;
  pMVar3 = (Matrix *)operator_new(0x30);
  start.__d.__r._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"vector:",(allocator *)((long)&start.__d.__r + 7));
  Matrix::Matrix(pMVar3,dim,1,&local_108);
  start.__d.__r._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&start.__d.__r + 7));
  local_e8 = pMVar3;
  Matrix::Random(pMVar3);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&end);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&elapsed_seconds);
  for (local_12c = 0; local_12c < 5; local_12c = local_12c + 1) {
    result1 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result1;
    local_140 = CSR::csrMult((CSR *)v1,local_e8);
    local_148 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_148;
    durationSym1 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_150,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym1);
    dStack_128.__r = local_150;
    local_160 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffed8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_160);
    pMVar3 = local_140;
    if (local_140 != (Matrix *)0x0) {
      Matrix::~Matrix(local_140);
      operator_delete(pMVar3,0x30);
    }
  }
  ppdVar1 = &tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  iVar4 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  iVar5 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar4._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar5._M_current);
  poVar6 = std::operator<<((ostream *)&std::cout,"multiply(CSR)");
  std::operator<<(poVar6,",");
  ppdVar1 = &tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)ppdVar1);
  x = (double)std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)ppdVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&x);
    if (!bVar2) break;
    pdVar8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    dStack_190 = *pdVar8;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dStack_190);
    std::operator<<(poVar6," ,");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  cc1._4_4_ = CSR::turntoCSC((CSR *)v1);
  pCVar7 = (CSC *)operator_new(0x30);
  CSC::CSC(pCVar7,dim,dim,cc1._4_4_,(int *)(v1->name).field_2._M_allocated_capacity,
           *(int **)((long)&(v1->name).field_2 + 8),(double *)(v1->name)._M_string_length);
  pCStack_1a0 = pCVar7;
  for (local_1a4 = 0; local_1a4 < 5; local_1a4 = local_1a4 + 1) {
    result2 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result2;
    local_1b8 = CSC::cscMult(pCStack_1a0,local_e8);
    local_1c0 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_1c0;
    durationSym2 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_1c8,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym2);
    dStack_128.__r = local_1c8;
    local_1d8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffed8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1d8);
    pMVar3 = local_1b8;
    if (local_1b8 != (Matrix *)0x0) {
      Matrix::~Matrix(local_1b8);
      operator_delete(pMVar3,0x30);
    }
  }
  ppdVar1 = &tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  iVar4 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  iVar5 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar4._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar5._M_current);
  poVar6 = std::operator<<((ostream *)&std::cout,"multiply(CSC)");
  std::operator<<(poVar6,",");
  ppdVar1 = &tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  __end1_1 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)ppdVar1);
  x_1 = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)ppdVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&x_1);
    if (!bVar2) break;
    pdVar8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_1);
    d1 = (diagonal *)*pdVar8;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(double)d1);
    std::operator<<(poVar6," ,");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMVar3 = (Matrix *)operator_new(0x18);
  diagonal::diagonal((diagonal *)pMVar3,dim,dim,dl);
  d2 = pMVar3;
  pMStack_218 = diagonal::diaStore((diagonal *)pMVar3,local_78,1);
  diagonal::offsetCompute((diagonal *)d2,1);
  for (local_21c = 0; local_21c < 5; local_21c = local_21c + 1) {
    result3 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result3;
    local_230 = diagonal::diaMult((diagonal *)d2,pMStack_218,local_e8);
    local_238 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_238;
    durationSym3 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_240,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym3);
    dStack_128.__r = local_240;
    local_250 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffed8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_250);
    pMVar3 = local_230;
    if (local_230 != (Matrix *)0x0) {
      Matrix::~Matrix(local_230);
      operator_delete(pMVar3,0x30);
    }
  }
  ppdVar1 = &tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  iVar4 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  iVar5 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar4._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar5._M_current);
  poVar6 = std::operator<<((ostream *)&std::cout,"multiply(dia1)");
  std::operator<<(poVar6,",");
  ppdVar1 = &tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  __end1_2 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)ppdVar1);
  x_2 = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)ppdVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&x_2);
    if (!bVar2) break;
    pdVar8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_2);
    m2 = (Matrix *)*pdVar8;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(double)m2);
    std::operator<<(poVar6," ,");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_2);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMStack_288 = diagonal::diaStore2((diagonal *)d2,local_78,1);
  for (local_28c = 0; local_28c < 5; local_28c = local_28c + 1) {
    result4 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result4;
    local_2a0 = diagonal::diaMult2((diagonal *)d2,pMStack_288,local_e8);
    local_2a8 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_2a8;
    durationSym4 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_2b0,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym4);
    dStack_128.__r = local_2b0;
    local_2c0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffed8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&dia1,&local_2c0);
    pMVar3 = local_2a0;
    if (local_2a0 != (Matrix *)0x0) {
      Matrix::~Matrix(local_2a0);
      operator_delete(pMVar3,0x30);
    }
  }
  iVar4 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)&dia1);
  iVar5 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)&dia1);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar4._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar5._M_current);
  poVar6 = std::operator<<((ostream *)&std::cout,"multiply(dia2)");
  std::operator<<(poVar6,",");
  __end1_3 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)&dia1);
  x_3 = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)&dia1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&x_3);
    if (!bVar2) break;
    pdVar8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_3);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pdVar8);
    std::operator<<(poVar6," ,");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_3);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMVar3 = local_78;
  if (local_78 != (Matrix *)0x0) {
    Matrix::~Matrix(local_78);
    operator_delete(pMVar3,0x30);
  }
  pMVar3 = v1;
  if (v1 != (Matrix *)0x0) {
    CSR::~CSR((CSR *)v1);
    operator_delete(pMVar3,0x30);
  }
  pMVar3 = local_e8;
  if (local_e8 != (Matrix *)0x0) {
    Matrix::~Matrix(local_e8);
    operator_delete(pMVar3,0x30);
  }
  pCVar7 = pCStack_1a0;
  if (pCStack_1a0 != (CSC *)0x0) {
    CSC::~CSC(pCStack_1a0);
    operator_delete(pCVar7,0x30);
  }
  pMVar3 = d2;
  if (d2 != (Matrix *)0x0) {
    diagonal::~diagonal((diagonal *)d2);
    operator_delete(pMVar3,0x18);
  }
  pMVar3 = pMStack_218;
  if (pMStack_218 != (Matrix *)0x0) {
    Matrix::~Matrix(pMStack_218);
    operator_delete(pMVar3,0x30);
  }
  pMVar3 = pMStack_288;
  if (pMStack_288 != (Matrix *)0x0) {
    Matrix::~Matrix(pMStack_288);
    operator_delete(pMVar3,0x30);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&dia1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &tm4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &tm3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &tm2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void generalMultTest1(int dim, int dl)
{
    // 5for rows - 2 for dia
    vector<double> tm1;
    vector<double> tm2;
    vector<double> tm3;
    vector<double> tm4;
    Matrix *dia1 = new Matrix(dim,dim," ");
    dia1->Random(dl,"diagonal");
    dia1->LowerTriangular();
    // dia1->print();

    //save matrix in csr format
    CSR *cr1 = new CSR(dia1);
    // cr1->triplet();
    Matrix *v1 = new Matrix(dim,1,"vector:");
     v1->Random();


    //execution time-start
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result1 = cr1->csrMult(v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end-start;
        double durationSym1=elapsed_seconds.count();
         //cout<<"execution time(CSR):"<< durationSym1<<"\n";
        //execution time-end
        //result1->print();
        tm1.push_back(durationSym1);
        delete result1;
    }
    sort(tm1.begin(), tm1.end());
    cout << "multiply(CSR)"<<",";
    for (auto x : tm1)
        cout << x << " ,";
    cout<<"\n";

    //save matrix in csc format
      int nnz = cr1->turntoCSC();
      CSC *cc1 = new CSC(dim,dim, nnz, cr1->ptr, cr1->idx, cr1->val);
    // cc1->Triplet();

    //execution time-start
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result2 = cc1->cscMult(v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end-start;
        double durationSym2=elapsed_seconds.count();
        // cout<<"execution time(CSC):"<< durationSym2 <<"\n";
        //execution time-end
        // result2->print();
        tm2.push_back(durationSym2);
        delete result2;
    }
    sort(tm2.begin(), tm2.end());
    cout << "multiply(CSC)"<<",";
    for (auto x : tm2)
        cout << x << " ,";
    cout<<"\n";

    //save matrix in diagonal format
    diagonal *d1 = new diagonal(dim,dim,dl);
    Matrix *d2 = d1->diaStore(dia1,1);
    d1->offsetCompute(1);
    //  d2->print();
    //execution time-start
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result3 = d1->diaMult(d2,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym3 = elapsed_seconds.count();
        //  cout << "execution time (dia):" << durationSym3 << "\n";
        //execution time-end
        //  result3->print();
        tm3.push_back(durationSym3);
        delete result3;
    }
    sort(tm3.begin(), tm3.end());
    cout << "multiply(dia1)"<<",";
    for (auto x : tm3)
        cout << x << " ,";
    cout<<"\n";

// diagonal2
    Matrix *m2 = d1->diaStore2(dia1, 1);
    // m2->print();
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result4 = d1->diaMult2(m2,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym4 = elapsed_seconds.count();
       //  cout << "execution time (dia2):" << durationSym4 << "\n";
        //result4->print();
        tm4.push_back(durationSym4);
        delete result4;
    }
    sort(tm4.begin(), tm4.end());
    cout << "multiply(dia2)"<<",";
    for (auto x : tm4)
        cout << x << " ,";
    cout<<"\n";

    //testing the result
    /*bool  t1 = result1->isequal(result2);
    bool  t2 = result2->isequal(result3);
    bool  t3 = result2->isequal(result4);
    bool  t4 = result3->isequal(result4);
    bool  t5 = result1->isequal(result4);
    cout << "the result of multiply of csc & csr & dia & dia2 is:"<< t1 <<","<< t2 << "," << t3<<"," << t4<<"," << t5<<"\n";

    cout<<  "\n";*/

    delete dia1;
    delete cr1;
    delete v1;
    delete cc1;
    delete d1;
    delete d2;
    delete m2;

}